

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

SnapContext * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *this)

{
  SnapContext *pSVar1;
  SnapContext *pSVar2;
  
  pSVar2 = (this->m_inlineHeadBlock).CurrPos;
  pSVar1 = (this->m_inlineHeadBlock).EndPos;
  if ((pSVar2 <= pSVar1) &&
     ((ulong)((long)pSVar2 - (long)(this->m_inlineHeadBlock).BlockData) < 0xe70)) {
    if (pSVar2 == pSVar1) {
      AddArrayLink(this);
      pSVar2 = (this->m_inlineHeadBlock).CurrPos;
    }
    (this->m_inlineHeadBlock).CurrPos = pSVar2 + 1;
    return pSVar2;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }